

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> * __thiscall
vkb::detail::
get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*const&>
          (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
           *__return_storage_ptr__,detail *this,
          _func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **f,
          VkPhysicalDevice_T **ts)

{
  uint32_t count;
  uint local_1c;
  
  local_1c = 0;
  (__return_storage_ptr__->
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)this)(*f,&local_1c,0);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            (__return_storage_ptr__,(ulong)local_1c);
  (**(code **)this)(*f,&local_1c,
                    (__return_storage_ptr__->
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            (__return_storage_ptr__,(ulong)local_1c);
  return __return_storage_ptr__;
}

Assistant:

auto get_vector_noerror(F&& f, Ts&&... ts) -> std::vector<T> {
    uint32_t count = 0;
    std::vector<T> results;
    f(ts..., &count, nullptr);
    results.resize(count);
    f(ts..., &count, results.data());
    results.resize(count);
    return results;
}